

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cc
# Opt level: O1

int __thiscall Server::listen(Server *this,int __fd,int __n)

{
  uint uVar1;
  ushort uVar2;
  int *piVar3;
  pointer piVar4;
  byte bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ssize_t sVar10;
  runtime_error *prVar11;
  int *piVar12;
  char *pcVar13;
  long lVar14;
  ulong *puVar15;
  allocator *paVar16;
  ulong uVar17;
  int iVar18;
  int *fileDescriptor;
  __normal_iterator<std::shared_ptr<ClientSocket>_*,_std::vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>_>
  __it;
  __normal_iterator<std::shared_ptr<ClientSocket>_*,_std::vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>_>
  _Var19;
  byte bVar20;
  shared_ptr<ClientSocket> clientSocket;
  int clientFileDescriptor;
  unsigned_long clientAddressLength;
  future<void> result;
  sockaddr_in clientAddress;
  fd_set masterSocketSet;
  sockaddr_in socketAddress;
  fd_set clientSocketSet;
  uint local_1c4;
  Server *local_1c0;
  value_type local_1b8;
  pthread_mutex_t *local_1a8;
  shared_ptr<ClientSocket> *local_1a0;
  int local_194;
  int local_190;
  int local_18c;
  function<void_(std::weak_ptr<ClientSocket>)> *local_188;
  function<void_(std::weak_ptr<ClientSocket>)> *local_180;
  vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_> *local_178;
  socklen_t local_170 [2];
  undefined1 local_168 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_160;
  uint *local_158;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_150;
  ulong local_148 [16];
  sockaddr local_c8;
  allocator local_b0 [128];
  
  bVar20 = 0;
  iVar7 = socket(2,1,0);
  this->_socket = iVar7;
  if (iVar7 == -1) {
LAB_00107f49:
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    piVar12 = __errno_location();
    pcVar13 = strerror(*piVar12);
    std::__cxx11::string::string((string *)local_148,pcVar13,local_b0);
    std::runtime_error::runtime_error(prVar11,(string *)local_148);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_148[0] = CONCAT44(local_148[0]._4_4_,1);
  setsockopt(iVar7,1,2,local_148,4);
  local_c8.sa_data[6] = '\0';
  local_c8.sa_data[7] = '\0';
  local_c8.sa_data[8] = '\0';
  local_c8.sa_data[9] = '\0';
  local_c8.sa_data[10] = '\0';
  local_c8.sa_data[0xb] = '\0';
  local_c8.sa_data[0xc] = '\0';
  local_c8.sa_data[0xd] = '\0';
  uVar2 = (ushort)this->_port;
  local_c8.sa_data._0_2_ = uVar2 << 8 | uVar2 >> 8;
  local_c8.sa_family = 2;
  local_c8.sa_data._2_4_ = 0;
  iVar7 = bind(this->_socket,&local_c8,0x10);
  if (iVar7 == -1) {
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    piVar12 = __errno_location();
    pcVar13 = strerror(*piVar12);
    std::__cxx11::string::string((string *)local_148,pcVar13,local_b0);
    std::runtime_error::runtime_error(prVar11,(string *)local_148);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar7 = ::listen(this->_socket,this->_backlog);
  if (iVar7 == -1) {
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    piVar12 = __errno_location();
    pcVar13 = strerror(*piVar12);
    std::__cxx11::string::string((string *)local_148,pcVar13,local_b0);
    std::runtime_error::runtime_error(prVar11,(string *)local_148);
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_148[0] = 0;
  local_148[1] = 0;
  local_148[2] = 0;
  local_148[3] = 0;
  local_148[4] = 0;
  local_148[5] = 0;
  local_148[6] = 0;
  local_148[7] = 0;
  local_148[8] = 0;
  local_148[9] = 0;
  local_148[10] = 0;
  local_148[0xb] = 0;
  local_148[0xc] = 0;
  local_148[0xd] = 0;
  local_148[0xe] = 0;
  local_148[0xf] = 0;
  iVar7 = this->_socket;
  iVar8 = iVar7 + 0x3f;
  if (-1 < iVar7) {
    iVar8 = iVar7;
  }
  local_148[iVar8 >> 6] = local_148[iVar8 >> 6] | 1L << ((byte)iVar7 & 0x3f);
  local_188 = &this->_handleRead;
  local_180 = &this->_handleAccept;
  local_178 = &this->_clientSockets;
  local_1a8 = (pthread_mutex_t *)&this->_staleFileDescriptorsMutex;
  local_1c0 = this;
  do {
    puVar15 = local_148;
    paVar16 = local_b0;
    for (lVar14 = 0x10; lVar14 != 0; lVar14 = lVar14 + -1) {
      *(ulong *)paVar16 = *puVar15;
      puVar15 = puVar15 + (ulong)bVar20 * -2 + 1;
      paVar16 = paVar16 + ((ulong)bVar20 * -2 + 1) * 8;
    }
    iVar8 = select(iVar7 + 1,(fd_set *)local_b0,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
    if (iVar8 != -1) {
      local_1c4 = 0;
      iVar18 = iVar7;
      local_194 = iVar8;
      if (-1 < iVar7) {
        uVar17 = 0;
        do {
          iVar8 = (int)uVar17;
          iVar9 = iVar8 + 0x3f;
          if (-1 < iVar8) {
            iVar9 = iVar8;
          }
          if ((*(ulong *)(local_b0 + (long)(iVar9 >> 6) * 8) >> (uVar17 & 0x3f) & 1) != 0) {
            if (iVar8 == this->_socket) {
              local_170[0] = 0x10;
              local_170[1] = 0;
              local_18c = accept(this->_socket,(sockaddr *)&local_158,local_170);
              if (local_18c == -1) break;
              iVar8 = local_18c + 0x3f;
              if (-1 < local_18c) {
                iVar8 = local_18c;
              }
              local_148[iVar8 >> 6] = local_148[iVar8 >> 6] | 1L << ((byte)local_18c & 0x3f);
              iVar18 = local_18c;
              if (local_18c < iVar7) {
                iVar18 = iVar7;
              }
              local_1b8.super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<ClientSocket,std::allocator<ClientSocket>,int&,Server&>
                        (&local_1b8.super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,(ClientSocket **)&local_1b8,
                         (allocator<ClientSocket> *)local_168,&local_18c,this);
              if (((this->_handleAccept).super__Function_base._M_manager != (_Manager_type)0x0) &&
                 (std::
                  async<std::function<void(std::weak_ptr<ClientSocket>)>&,std::shared_ptr<ClientSocket>&>
                            ((launch)local_168,(function<void_(std::weak_ptr<ClientSocket>)> *)0x1,
                             (shared_ptr<ClientSocket> *)local_180),
                 local_160 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_160);
              }
              std::
              vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>
              ::push_back(local_178,&local_1b8);
              if (local_1b8.super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_1b8.super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
            }
            else {
              local_1b8.super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)
                   ((ulong)local_1b8.super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr & 0xffffffffffff0000);
              sVar10 = recv(iVar8,&local_1b8,1,2);
              if ((int)sVar10 < 1) {
                close(this,local_1c4);
              }
              else {
                __it._M_current =
                     (this->_clientSockets).
                     super__Vector_base<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                local_1a0 = (this->_clientSockets).
                            super__Vector_base<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                local_158 = &local_1c4;
                lVar14 = (long)local_1a0 - (long)__it._M_current >> 6;
                local_190 = iVar18;
                if (0 < lVar14) {
                  lVar14 = lVar14 + 1;
                  do {
                    bVar6 = __gnu_cxx::__ops::_Iter_pred<Server::listen()::$_0>::operator()
                                      ((_Iter_pred<Server::listen()::__0> *)&local_158,__it);
                    this = local_1c0;
                    _Var19._M_current = __it._M_current;
                    if (bVar6) goto LAB_00107e69;
                    bVar6 = __gnu_cxx::__ops::_Iter_pred<Server::listen()::$_0>::operator()
                                      ((_Iter_pred<Server::listen()::__0> *)&local_158,
                                       __it._M_current + 1);
                    this = local_1c0;
                    _Var19._M_current = __it._M_current + 1;
                    if (bVar6) goto LAB_00107e69;
                    bVar6 = __gnu_cxx::__ops::_Iter_pred<Server::listen()::$_0>::operator()
                                      ((_Iter_pred<Server::listen()::__0> *)&local_158,
                                       __it._M_current + 2);
                    this = local_1c0;
                    _Var19._M_current = __it._M_current + 2;
                    if (bVar6) goto LAB_00107e69;
                    bVar6 = __gnu_cxx::__ops::_Iter_pred<Server::listen()::$_0>::operator()
                                      ((_Iter_pred<Server::listen()::__0> *)&local_158,
                                       __it._M_current + 3);
                    this = local_1c0;
                    _Var19._M_current = __it._M_current + 3;
                    if (bVar6) goto LAB_00107e69;
                    __it._M_current = __it._M_current + 4;
                    lVar14 = lVar14 + -1;
                  } while (1 < lVar14);
                }
                this = local_1c0;
                lVar14 = (long)local_1a0 - (long)__it._M_current >> 4;
                if (lVar14 == 1) {
LAB_00107e53:
                  bVar6 = __gnu_cxx::__ops::_Iter_pred<Server::listen()::$_0>::operator()
                                    ((_Iter_pred<Server::listen()::__0> *)&local_158,__it);
                  _Var19._M_current = local_1a0;
                  if (bVar6) {
                    _Var19._M_current = __it._M_current;
                  }
                }
                else if (lVar14 == 2) {
LAB_00107e16:
                  bVar6 = __gnu_cxx::__ops::_Iter_pred<Server::listen()::$_0>::operator()
                                    ((_Iter_pred<Server::listen()::__0> *)&local_158,__it);
                  _Var19._M_current = __it._M_current;
                  if (!bVar6) {
                    __it._M_current = __it._M_current + 1;
                    goto LAB_00107e53;
                  }
                }
                else {
                  _Var19._M_current = local_1a0;
                  if ((lVar14 == 3) &&
                     (bVar6 = __gnu_cxx::__ops::_Iter_pred<Server::listen()::$_0>::operator()
                                        ((_Iter_pred<Server::listen()::__0> *)&local_158,__it),
                     _Var19._M_current = __it._M_current, !bVar6)) {
                    __it._M_current = __it._M_current + 1;
                    goto LAB_00107e16;
                  }
                }
LAB_00107e69:
                iVar18 = local_190;
                if (((_Var19._M_current !=
                      (this->_clientSockets).
                      super__Vector_base<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) &&
                    ((this->_handleRead).super__Function_base._M_manager != (_Manager_type)0x0)) &&
                   (std::
                    async<std::function<void(std::weak_ptr<ClientSocket>)>&,std::shared_ptr<ClientSocket>&>
                              ((launch)(sockaddr *)&local_158,
                               (function<void_(std::weak_ptr<ClientSocket>)> *)0x1,
                               (shared_ptr<ClientSocket> *)local_188),
                   local_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150);
                }
              }
            }
          }
          uVar1 = local_1c4 + 1;
          uVar17 = (ulong)uVar1;
          bVar6 = (int)local_1c4 < iVar7;
          local_1c4 = uVar1;
        } while (bVar6);
      }
      if (iVar7 < iVar18) {
        iVar7 = iVar18;
      }
      iVar8 = pthread_mutex_lock(local_1a8);
      if (iVar8 != 0) {
        std::__throw_system_error(iVar8);
        goto LAB_00107f49;
      }
      piVar3 = (this->_staleFileDescriptors).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (piVar12 = (this->_staleFileDescriptors).super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start; piVar12 != piVar3;
          piVar12 = piVar12 + 1) {
        iVar8 = *piVar12;
        bVar5 = (byte)iVar8 & 0x3f;
        iVar18 = iVar8 + 0x3f;
        if (-1 < iVar8) {
          iVar18 = iVar8;
        }
        local_148[iVar18 >> 6] =
             local_148[iVar18 >> 6] & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
        ::close(iVar8);
      }
      piVar4 = (this->_staleFileDescriptors).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->_staleFileDescriptors).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar4) {
        (this->_staleFileDescriptors).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = piVar4;
      }
      pthread_mutex_unlock(local_1a8);
      iVar8 = local_194;
    }
    if (iVar8 == -1) {
      return -1;
    }
  } while( true );
}

Assistant:

void Server::listen()
{
  _socket = socket( AF_INET, SOCK_STREAM, 0 );

  if( _socket == -1 )
    throw std::runtime_error( std::string( strerror( errno ) ) );

  {
    int option = 1;

    setsockopt( _socket,
                SOL_SOCKET,
                SO_REUSEADDR,
                reinterpret_cast<const void*>( &option ),
                sizeof( option ) );
  }

  sockaddr_in socketAddress;

  std::fill( reinterpret_cast<char*>( &socketAddress ),
             reinterpret_cast<char*>( &socketAddress ) + sizeof( socketAddress ),
             0 );

  socketAddress.sin_family      = AF_INET;
  socketAddress.sin_addr.s_addr = htonl( INADDR_ANY );
  socketAddress.sin_port        = htons( _port );

  {
    int result = bind( _socket,
                       reinterpret_cast<const sockaddr*>( &socketAddress ),
                       sizeof( socketAddress ) );

    if( result == -1 )
      throw std::runtime_error( std::string( strerror( errno ) ) );
  }

  {
    int result = ::listen( _socket, _backlog );

    if( result == -1 )
      throw std::runtime_error( std::string( strerror( errno ) ) );
  }

  fd_set masterSocketSet;
  fd_set clientSocketSet;

  FD_ZERO( &masterSocketSet );
  FD_SET( _socket, &masterSocketSet );

  int highestFileDescriptor = _socket;

  while( 1 )
  {
    clientSocketSet = masterSocketSet;

    int numFileDescriptors = select( highestFileDescriptor + 1,
                                     &clientSocketSet,
                                     nullptr,   // no descriptors to write into
                                     nullptr,   // no descriptors with exceptions
                                     nullptr ); // no timeout

    if( numFileDescriptors == -1 )
      break;

    // Will be updated in the loop as soon as a new client has been
    // accepted. This saves us from modifying the variable *during*
    // the loop execution.
    int newHighestFileDescriptor = highestFileDescriptor;

    for( int i = 0; i <= highestFileDescriptor; i++ )
    {
      if( !FD_ISSET( i, &clientSocketSet ) )
        continue;

      // Handle new client
      if( i == _socket )
      {
        sockaddr_in clientAddress;
        auto clientAddressLength = sizeof(clientAddress);

        int clientFileDescriptor = accept( _socket,
                                           reinterpret_cast<sockaddr*>( &clientAddress ),
                                           reinterpret_cast<socklen_t*>( &clientAddressLength ) );

        if( clientFileDescriptor == -1 )
          break;

        FD_SET( clientFileDescriptor, &masterSocketSet );
        newHighestFileDescriptor = std::max( highestFileDescriptor, clientFileDescriptor );

        auto clientSocket = std::make_shared<ClientSocket>( clientFileDescriptor, *this );

        if( _handleAccept )
          auto result = std::async( std::launch::async, _handleAccept, clientSocket );

        _clientSockets.push_back( clientSocket );
      }

      // Known client socket
      else
      {
        char buffer[2] = {0,0};

        // Let's attempt to read at least one byte from the connection, but
        // without removing it from the queue. That way, the server can see
        // whether a client has closed the connection.
        int result = recv( i, buffer, 1, MSG_PEEK );

        if( result <= 0 )
        {
          // It would be easier to use erase-remove here, but this leads
          // to a deadlock. Instead, the current socket will be added to
          // the list of stale sockets and be closed later on.
          this->close( i );
        }
        else
        {
          auto itSocket = std::find_if( _clientSockets.begin(), _clientSockets.end(),
                                        [&] ( std::shared_ptr<ClientSocket> socket )
                                        {
                                          return socket->fileDescriptor() == i;
                                        } );

          if( itSocket != _clientSockets.end() && _handleRead )
            auto result = std::async( std::launch::async, _handleRead, *itSocket );
        }
      }
    }

    // Update the file descriptor if a new client has been accepted in
    // the loop above.
    highestFileDescriptor = std::max( newHighestFileDescriptor, highestFileDescriptor );

    // Handle stale connections. This is in an extra scope so that the
    // lock guard unlocks the mutex automatically.
    {
      std::lock_guard<std::mutex> lock( _staleFileDescriptorsMutex );

      for( auto&& fileDescriptor : _staleFileDescriptors )
      {
        FD_CLR( fileDescriptor, &masterSocketSet );
        ::close( fileDescriptor );
      }

      _staleFileDescriptors.clear();
    }
  }
}